

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDF::getRoot(QPDF *this)

{
  bool bVar1;
  pointer pMVar2;
  QPDFExc *__return_storage_ptr__;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *in_RSI;
  QPDFObjectHandle QVar4;
  byte local_259;
  QPDFObjectHandle local_210;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  QPDFExc local_188;
  byte local_103;
  byte local_102;
  allocator<char> local_101;
  string local_100;
  byte local_dc;
  byte local_db;
  byte local_da;
  allocator<char> local_d9;
  string local_d8 [32];
  QPDFObjectHandle local_b8;
  undefined1 local_a2;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40 [39];
  undefined1 local_19;
  QPDF *this_local;
  QPDFObjectHandle *root;
  
  local_19 = 0;
  this_local = this;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/Root",&local_41);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)&pMVar2->trailer);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)this);
  if (!bVar1) {
    local_a2 = 1;
    __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"unable to find /Root dictionary",&local_a1);
    damagedPDF(__return_storage_ptr__,(QPDF *)in_RSI,&local_78,-1,&local_a0);
    local_a2 = 0;
    __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(in_RSI);
  local_da = 0;
  local_db = 0;
  local_dc = 0;
  local_102 = 0;
  local_103 = 0;
  local_259 = 0;
  _Var3._M_pi = extraout_RDX;
  if ((pMVar2->check_mode & 1U) != 0) {
    std::allocator<char>::allocator();
    local_da = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_d8,"/Type",&local_d9);
    local_db = 1;
    QPDFObjectHandle::getKey(&local_b8,(string *)this);
    local_dc = 1;
    std::allocator<char>::allocator();
    local_102 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"/Catalog",&local_101);
    local_103 = 1;
    bVar1 = QPDFObjectHandle::isNameAndEquals(&local_b8,&local_100);
    local_259 = bVar1 ^ 0xff;
    _Var3._M_pi = extraout_RDX_00;
  }
  if ((local_103 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_100);
    _Var3._M_pi = extraout_RDX_01;
  }
  if ((local_102 & 1) != 0) {
    std::allocator<char>::~allocator(&local_101);
    _Var3._M_pi = extraout_RDX_02;
  }
  if ((local_dc & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle(&local_b8);
    _Var3._M_pi = extraout_RDX_03;
  }
  if ((local_db & 1) != 0) {
    std::__cxx11::string::~string(local_d8);
    _Var3._M_pi = extraout_RDX_04;
  }
  if ((local_da & 1) != 0) {
    std::allocator<char>::~allocator(&local_d9);
    _Var3._M_pi = extraout_RDX_05;
  }
  if ((local_259 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"",&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"catalog /Type entry missing or invalid",&local_1d1);
    damagedPDF(&local_188,(QPDF *)in_RSI,&local_1a8,-1,&local_1d0);
    warn((QPDF *)in_RSI,&local_188);
    QPDFExc::~QPDFExc(&local_188);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"/Type",&local_1f9);
    operator____qpdf((char *)&local_210,0x410c23);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_1f8,&local_210);
    QPDFObjectHandle::~QPDFObjectHandle(&local_210);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    _Var3._M_pi = extraout_RDX_06;
  }
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::getRoot()
{
    QPDFObjectHandle root = m->trailer.getKey("/Root");
    if (!root.isDictionary()) {
        throw damagedPDF("", -1, "unable to find /Root dictionary");
    } else if (
        // Check_mode is an interim solution to request #810 pending a more comprehensive review of
        // the approach to more extensive checks and warning levels.
        m->check_mode && !root.getKey("/Type").isNameAndEquals("/Catalog")) {
        warn(damagedPDF("", -1, "catalog /Type entry missing or invalid"));
        root.replaceKey("/Type", "/Catalog"_qpdf);
    }
    return root;
}